

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_attr_float(exr_context_t ctxt,exr_attribute_t *a)

{
  exr_result_t eVar1;
  exr_context_t in_RSI;
  exr_context_t in_RDI;
  float tmp;
  exr_result_t rv;
  uint uVar2;
  
  uVar2 = (in_RSI->tmp_filename).length;
  eVar1 = save_attr_sz(in_RDI,(size_t)in_RSI);
  if (eVar1 == 0) {
    eVar1 = save_attr_32(in_RSI,(void *)(ulong)uVar2,0);
  }
  return eVar1;
}

Assistant:

static exr_result_t
save_attr_float (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;
    float        tmp = a->f;

    rv = save_attr_sz (ctxt, sizeof (float));
    if (rv == EXR_ERR_SUCCESS) rv = save_attr_32 (ctxt, &tmp, 1);
    return rv;
}